

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_cat(char **pdest,char *src,size_t *pndest)

{
  char *pcVar1;
  bool bVar2;
  char *end;
  char *dest;
  size_t *pndest_local;
  char *src_local;
  char **pdest_local;
  
  end = *pdest;
  pcVar1 = end + *pndest;
  while( true ) {
    bVar2 = false;
    if (end < pcVar1) {
      bVar2 = *end != '\0';
    }
    pndest_local = (size_t *)src;
    if (!bVar2) break;
    end = end + 1;
  }
  while( true ) {
    bVar2 = false;
    if (end < pcVar1) {
      bVar2 = (char)*pndest_local != '\0';
    }
    if (!bVar2) break;
    *end = (char)*pndest_local;
    end = end + 1;
    pndest_local = (size_t *)((long)pndest_local + 1);
  }
  *end = '\0';
  *pndest = (long)pcVar1 - (long)end;
  *pdest = end;
  return;
}

Assistant:

static
void arg_cat(char * *pdest, const char * src, size_t * pndest) {
	char * dest = *pdest;
	char * end  = dest + *pndest;

	/*locate null terminator of dest string */
	while (dest < end && *dest != 0) {
		dest++;
	}

	/* concat src string to dest string */
	while (dest < end && *src != 0) {
		*dest++ = *src++;
	}

	/* null terminate dest string */
	*dest = 0;

	/* update *pdest and *pndest */
	*pndest = end - dest;
	*pdest  = dest;
}